

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O3

void __thiscall FR<8U>::Init(FR<8U> *this,Data<8U> *data)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  bool bVar4;
  uint position;
  uint uVar5;
  Counter *pCVar6;
  bool bVar7;
  int i;
  uint uVar8;
  long lVar9;
  bool bVar10;
  
  uVar8 = 0;
  bVar10 = true;
  do {
    uVar5 = Data<8U>::Hash(data,uVar8);
    uVar3 = (ulong)uVar5 % (ulong)(uint)this->LENGTH;
    puVar2 = this->bitset->bitset;
    bVar1 = puVar2[uVar3 >> 3];
    if ((bVar1 >> ((uint)uVar3 & 7) & 1) == 0) {
      puVar2[uVar3 >> 3] = (byte)(1 << ((byte)uVar3 & 7)) | bVar1;
      bVar10 = false;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 3);
  uVar8 = 0;
  bVar4 = true;
  do {
    bVar7 = bVar4;
    uVar8 = Data<8U>::Hash(data,uVar8);
    uVar3 = (ulong)uVar8 % (ulong)(uint)this->SIZE;
    pCVar6 = this->counter;
    if (!bVar10) {
      this->flow = this->flow + 1;
      lVar9 = 0;
      do {
        puVar2 = pCVar6[uVar3].data.str + lVar9;
        *puVar2 = *puVar2 ^ data->str[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 8);
      pCVar6 = this->counter;
      pCVar6[uVar3].count = pCVar6[uVar3].count + 1;
    }
    pCVar6[uVar3].packet = pCVar6[uVar3].packet + 1;
    uVar8 = 1;
    bVar4 = false;
  } while (bVar7);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& data) {
		bool init = true;
		for (int i = 0; i < 3; ++i) {
			uint position = data.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		for (int i = 0; i < 2; ++i) {
			uint position = data.Hash(i) % SIZE;
			if (!init) {
				flow++;
				counter[position].data ^= data;
				counter[position].count += 1;
			}
			counter[position].packet += 1;
		}
	}